

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<kratos::Stmt*,kratos::IRNode*>::load_impl_sequence<0ul,1ul>
          (argument_loader<kratos::Stmt*,kratos::IRNode*> *this,long call)

{
  bool bVar1;
  type_caster_generic *ptVar2;
  reference pvVar3;
  byte local_51;
  reference local_50;
  handle local_40;
  reference local_38;
  handle local_28;
  long local_20;
  function_call *call_local;
  argument_loader<kratos::Stmt_*,_kratos::IRNode_*> *this_local;
  
  local_20 = call;
  call_local = (function_call *)this;
  ptVar2 = (type_caster_generic *)
           std::
           get<0ul,pybind11::detail::type_caster<kratos::Stmt,void>,pybind11::detail::type_caster<kratos::IRNode,void>>
                     ((tuple<pybind11::detail::type_caster<kratos::Stmt,_void>,_pybind11::detail::type_caster<kratos::IRNode,_void>_>
                       *)this);
  pvVar3 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_20 + 8),
                      0);
  local_28.m_ptr = pvVar3->m_ptr;
  local_38 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),0);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_38);
  bVar1 = type_caster_generic::load(ptVar2,local_28,bVar1);
  local_51 = 1;
  if (bVar1) {
    ptVar2 = (type_caster_generic *)
             std::
             get<1ul,pybind11::detail::type_caster<kratos::Stmt,void>,pybind11::detail::type_caster<kratos::IRNode,void>>
                       ((tuple<pybind11::detail::type_caster<kratos::Stmt,_void>,_pybind11::detail::type_caster<kratos::IRNode,_void>_>
                         *)this);
    pvVar3 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                       ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                        (local_20 + 8),1);
    local_40.m_ptr = pvVar3->m_ptr;
    local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)(local_20 + 0x20),1);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_50);
    bVar1 = type_caster_generic::load(ptVar2,local_40,bVar1);
    local_51 = bVar1 ^ 0xff;
  }
  return (local_51 & 1) == 0;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }